

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

BinOpr expr_binop(LexState *ls,ExpDesc *v,uint32_t limit)

{
  int iVar1;
  BCPos BVar2;
  anon_union_8_3_2ce71dea_for_u aVar3;
  uint uVar4;
  ExpKind EVar5;
  BinOpr BVar6;
  BCReg BVar7;
  BCReg BVar8;
  BCReg BVar9;
  BCPos BVar10;
  undefined4 uVar11;
  TValue TVar12;
  undefined8 uVar13;
  BCIns ins;
  uint32_t uVar14;
  BinOpr BVar15;
  ulong uVar16;
  uint uVar17;
  BCPos *l1;
  anon_union_8_3_2ce71dea_for_u *paVar18;
  anon_union_8_3_2ce71dea_for_u *paVar19;
  FuncState *pFVar20;
  GCstr *pGVar21;
  TValue *o;
  ExpDesc v2;
  anon_union_8_3_2ce71dea_for_u local_60;
  int iStack_58;
  BCPos BStack_54;
  BCPos local_50;
  undefined4 uStack_4c;
  LexState *local_48;
  BinOpr local_40;
  uint32_t local_3c;
  BCPos *local_38;
  
  uVar4 = ls->level + 1;
  ls->level = uVar4;
  local_3c = limit;
  if (199 < uVar4) {
    lj_lex_error(ls,0,LJ_ERR_XLEVELS);
  }
  iVar1 = ls->token;
  if (0x113 < iVar1) {
    if (iVar1 < 0x11e) {
      if (iVar1 == 0x114) {
        uVar13 = 0xffffffff00000002;
        goto LAB_0011a844;
      }
      if (iVar1 != 0x118) {
switchD_0011a6b9_caseD_108:
        expr_primary(ls,v);
        goto LAB_0011a9e2;
      }
      pFVar20 = ls->fs;
      if ((pFVar20->flags & 2) == 0) {
        err_syntax(ls,LJ_ERR_XDOTS);
      }
      bcreg_reserve(pFVar20,1);
      uVar14 = pFVar20->freereg - 1;
      BVar10 = bcemit_INS(pFVar20,(uint)pFVar20->numparams << 0x10 | uVar14 * 0x100 | 0x2000043);
      v->k = VCALL;
      (v->u).s.info = BVar10;
      v->t = 0xffffffff;
      v->f = 0xffffffff;
      (v->u).s.aux = uVar14;
    }
    else {
      if (iVar1 == 0x11e) {
        v->k = (ls->tokenval).field_2.it == 0xfffffff5 | VKLAST;
        (v->u).s.info = 0;
        v->t = 0xffffffff;
        v->f = 0xffffffff;
        TVar12 = ls->tokenval;
      }
      else {
        if (iVar1 != 0x120) goto switchD_0011a6b9_caseD_108;
        v->k = VKSTR;
        v->t = 0xffffffff;
        (v->u).s.info = 0;
        v->f = 0xffffffff;
        TVar12.field_2.it = 0;
        TVar12.field_2.field_0 =
             (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
             (ls->tokenval).u32.lo;
      }
      v->u = (anon_union_8_3_2ce71dea_for_u)TVar12;
    }
    goto LAB_0011a880;
  }
  if (iVar1 < 0x107) {
    if (iVar1 == 0x23) {
      lj_lex_next(ls);
      expr_binop(ls,v,8);
      pFVar20 = ls->fs;
      uVar4 = 0x13;
    }
    else {
      if (iVar1 != 0x2d) {
        if (iVar1 != 0x7b) goto switchD_0011a6b9_caseD_108;
        expr_table(ls,v);
        goto LAB_0011a9e2;
      }
      lj_lex_next(ls);
      expr_binop(ls,v,8);
      pFVar20 = ls->fs;
      uVar4 = 0x12;
      if (v->t == v->f) {
        if (v->k == VKLAST) {
          if (((ulong)(v->u).sval & 0x7fffffffffffffff) == 0) goto LAB_0011a902;
          (v->u).sval = (GCstr *)((ulong)(v->u).sval ^ 0x8000000000000000);
        }
        else {
          if (v->k != VKCDATA) goto LAB_0011a902;
          uVar16 = (ulong)(v->u).s.info;
          if (*(short *)(uVar16 + 6) == 0x10) {
            *(byte *)(uVar16 + 0x17) = *(byte *)(uVar16 + 0x17) ^ 0x80;
          }
          else {
            *(long *)(uVar16 + 8) = -*(long *)(uVar16 + 8);
          }
        }
        goto LAB_0011a9e2;
      }
    }
LAB_0011a902:
    expr_toanyreg(pFVar20,v);
    EVar5 = v->k;
LAB_0011a911:
    uVar17 = (v->u).s.info;
    if (EVar5 == VNONRELOC) {
LAB_0011a919:
      if (pFVar20->nactvar <= uVar17) {
        pFVar20->freereg = pFVar20->freereg - 1;
        uVar17 = (v->u).s.info;
      }
    }
    BVar10 = bcemit_INS(pFVar20,uVar17 << 0x10 | uVar4);
    (v->u).s.info = BVar10;
    v->k = VRELOCABLE;
    goto LAB_0011a9e2;
  }
  switch(iVar1) {
  case 0x107:
    uVar13 = 0xffffffff00000001;
    goto LAB_0011a844;
  default:
    goto switchD_0011a6b9_caseD_108;
  case 0x109:
    lj_lex_next(ls);
    parse_body(ls,v,0,ls->linenumber);
    break;
  case 0x10e:
    uVar13 = 0xffffffff00000000;
LAB_0011a844:
    v->k = (int)uVar13;
    v->t = (int)((ulong)uVar13 >> 0x20);
    (v->u).s.info = 0;
    v->f = 0xffffffff;
LAB_0011a880:
    lj_lex_next(ls);
    break;
  case 0x10f:
    lj_lex_next(ls);
    expr_binop(ls,v,8);
    pFVar20 = ls->fs;
    BVar10 = v->t;
    BVar2 = v->f;
    v->f = BVar10;
    v->t = BVar2;
    jmp_dropval(pFVar20,BVar10);
    jmp_dropval(pFVar20,v->t);
    expr_discharge(pFVar20,v);
    EVar5 = v->k;
    if (EVar5 < VKTRUE) {
      v->k = VKTRUE;
    }
    else if (EVar5 - VKTRUE < 4) {
      v->k = VKFALSE;
    }
    else {
      if (EVar5 != VJMP) {
        uVar4 = 0x11;
        if (EVar5 != VRELOCABLE) goto LAB_0011a911;
        bcreg_reserve(pFVar20,1);
        *(char *)((long)&pFVar20->bcbase[(v->u).s.info].ins + 1) = (char)pFVar20->freereg + -1;
        uVar17 = pFVar20->freereg - 1;
        (v->u).s.info = uVar17;
        v->k = VNONRELOC;
        uVar4 = 0x11;
        goto LAB_0011a919;
      }
      *(byte *)&pFVar20->bcbase[(v->u).s.info - 1].ins =
           (byte)pFVar20->bcbase[(v->u).s.info - 1].ins ^ 1;
    }
  }
LAB_0011a9e2:
  iVar1 = ls->token;
  BVar15 = OPR_NOBINOPR;
  if (iVar1 < 0x5e) {
    switch(iVar1) {
    case 0x25:
      uVar16 = 4;
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
      goto switchD_0011aa06_caseD_26;
    case 0x2a:
      uVar16 = 2;
      break;
    case 0x2b:
      uVar16 = 0;
      break;
    case 0x2d:
      uVar16 = 1;
      break;
    case 0x2f:
      uVar16 = 3;
      break;
    default:
      if (iVar1 == 0x3c) {
        uVar16 = 9;
      }
      else {
        if (iVar1 != 0x3e) goto switchD_0011aa06_caseD_26;
        uVar16 = 0xc;
      }
    }
  }
  else {
    switch(iVar1) {
    case 0x110:
      uVar16 = 0xe;
      break;
    case 0x111:
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x116:
    case 0x118:
      goto switchD_0011aa06_caseD_26;
    case 0x117:
      uVar16 = 6;
      break;
    case 0x119:
      uVar16 = 8;
      break;
    case 0x11a:
      uVar16 = 10;
      break;
    case 0x11b:
      uVar16 = 0xb;
      break;
    case 0x11c:
      uVar16 = 7;
      break;
    default:
      if (iVar1 == 0x5e) {
        uVar16 = 5;
      }
      else {
        if (iVar1 != 0x101) goto switchD_0011aa06_caseD_26;
        uVar16 = 0xd;
      }
    }
  }
  local_38 = &v->t;
  local_48 = ls;
  do {
    BVar15 = (BinOpr)uVar16;
    if (priority[uVar16].left <= local_3c) goto switchD_0011aa06_caseD_26;
    lj_lex_next(ls);
    pFVar20 = ls->fs;
    if (BVar15 == OPR_CONCAT) {
      expr_tonextreg(pFVar20,v);
    }
    else if (BVar15 == OPR_OR) {
      expr_discharge(pFVar20,v);
      EVar5 = v->k;
      if (EVar5 - VKTRUE < 3) {
        expr_toreg_nobranch(pFVar20,v,0xff);
        BVar10 = bcemit_jmp(pFVar20);
      }
      else {
        BVar10 = 0xffffffff;
        if (VKFALSE < EVar5) {
          if (EVar5 == VJMP) {
            BVar10 = (v->u).s.info;
          }
          else {
            BVar10 = bcemit_branch(pFVar20,v,1);
          }
        }
      }
      jmp_append(pFVar20,local_38,BVar10);
      BVar10 = v->f;
      pFVar20->lasttarget = pFVar20->pc;
      jmp_append(pFVar20,&pFVar20->jpc,BVar10);
      v->f = 0xffffffff;
      ls = local_48;
    }
    else if (BVar15 == OPR_AND) {
      bcemit_branch_t(pFVar20,v);
    }
    else {
      if (BVar15 - OPR_NE < 2) {
        if (v->k < VKCDATA) {
LAB_0011ab61:
          if (v->t == v->f) goto LAB_0011abde;
        }
      }
      else if (v->k == VKLAST) goto LAB_0011ab61;
      expr_toanyreg(pFVar20,v);
    }
LAB_0011abde:
    BVar6 = expr_binop(ls,(ExpDesc *)&local_60.s,(uint)priority[uVar16].right);
    pFVar20 = ls->fs;
    if (BVar15 < OPR_CONCAT) {
      if ((((v->k == VKLAST) && (v->t == v->f)) && (iStack_58 == 4)) &&
         ((BStack_54 == local_50 &&
          (pGVar21 = (GCstr *)lj_vm_foldarith((v->u).sval,CONCAT44(local_60.s.aux,local_60.s.info),
                                              uVar16),
          ((ulong)pGVar21 & 0x7fffffffffffffff) < 0x7ff0000000000001)))) {
        (v->u).sval = pGVar21;
      }
      else {
        if (BVar15 == OPR_POW) {
          BVar7 = expr_toanyreg(pFVar20,(ExpDesc *)&local_60.s);
          BVar8 = expr_toanyreg(pFVar20,v);
          uVar4 = 0x23;
        }
        else {
          expr_toval(pFVar20,(ExpDesc *)&local_60.s);
          if ((iStack_58 == 4) && (BVar9 = const_num(pFVar20,(ExpDesc *)&local_60.s), BVar9 < 0x100)
             ) {
            uVar4 = BVar15 + 0x14;
          }
          else {
            uVar4 = BVar15 + 0x1e;
            BVar9 = expr_toanyreg(pFVar20,(ExpDesc *)&local_60.s);
          }
          expr_toval(pFVar20,v);
          if (((v->k == VKLAST) && (iStack_58 != 4)) &&
             (BVar7 = const_num(pFVar20,v), BVar7 < 0x100)) {
            uVar4 = uVar4 - 5;
            BVar8 = BVar9;
          }
          else {
            BVar8 = expr_toanyreg(pFVar20,v);
            BVar7 = BVar9;
          }
        }
        if ((v->k == VNONRELOC) && (pFVar20->nactvar <= (v->u).s.info)) {
          pFVar20->freereg = pFVar20->freereg - 1;
        }
        if ((iStack_58 == 0xc) && (pFVar20->nactvar <= local_60.s.info)) {
          pFVar20->freereg = pFVar20->freereg - 1;
        }
        BVar10 = bcemit_INS(pFVar20,BVar7 << 0x10 | BVar8 << 0x18 | uVar4);
        (v->u).s.info = BVar10;
        v->k = VRELOCABLE;
        ls = local_48;
      }
    }
    else if (BVar15 == OPR_CONCAT) {
      expr_toval(pFVar20,(ExpDesc *)&local_60.s);
      if (iStack_58 == 0xb) {
        if ((char)pFVar20->bcbase[local_60.s.info].ins != '$') goto LAB_0011aecc;
        uVar4 = (v->u).s.info;
        if ((v->k == VNONRELOC) && (pFVar20->nactvar <= uVar4)) {
          pFVar20->freereg = pFVar20->freereg - 1;
          uVar4 = (v->u).s.info;
        }
        *(char *)((long)&pFVar20->bcbase[local_60.s.info].ins + 3) = (char)uVar4;
        uVar11 = local_60.s.info;
      }
      else {
LAB_0011aecc:
        expr_tonextreg(pFVar20,(ExpDesc *)&local_60.s);
        if ((iStack_58 == 0xc) && (pFVar20->nactvar <= local_60.s.info)) {
          pFVar20->freereg = pFVar20->freereg - 1;
        }
        uVar4 = (v->u).s.info;
        if ((v->k == VNONRELOC) && (pFVar20->nactvar <= uVar4)) {
          pFVar20->freereg = pFVar20->freereg - 1;
          uVar4 = (v->u).s.info;
        }
        uVar11 = bcemit_INS(pFVar20,local_60.s.info << 0x10 | uVar4 << 0x18 | 0x24);
      }
      (v->u).s.info = uVar11;
      v->k = VRELOCABLE;
    }
    else {
      if (BVar15 == OPR_OR) {
        expr_discharge(pFVar20,(ExpDesc *)&local_60.s);
        BVar10 = v->t;
        l1 = &BStack_54;
      }
      else {
        if (BVar15 != OPR_AND) {
          local_40 = BVar6;
          expr_toval(pFVar20,v);
          paVar18 = &v->u;
          paVar19 = &local_60;
          if (BVar15 - OPR_NE < 2) {
            uVar4 = BVar15 == OPR_EQ ^ 5;
            if (v->k < VKCDATA) {
              paVar18 = &local_60;
              paVar19 = &v->u;
            }
            BVar9 = expr_toanyreg(pFVar20,(ExpDesc *)&paVar18->s);
            expr_toval(pFVar20,(ExpDesc *)&paVar19->s);
            EVar5 = paVar19[1].s.info;
            if (EVar5 < VKSTR) {
              ins = EVar5 << 0x10 | uVar4 + BVar9 * 0x100 + 6;
            }
            else if (EVar5 == VKSTR) {
              BVar7 = const_gc(pFVar20,(GCobj *)((anon_union_8_3_2ce71dea_for_u *)&(paVar19->s).info
                                                )->sval,0xfffffffb);
              ins = (BVar7 << 0x10 | BVar9 << 8) + uVar4 + 2;
            }
            else if (EVar5 == VKLAST) {
              BVar7 = const_num(pFVar20,(ExpDesc *)&paVar19->s);
              ins = BVar7 << 0x10 | BVar9 * 0x100 + uVar4 + 4;
            }
            else {
              BVar7 = expr_toanyreg(pFVar20,(ExpDesc *)&paVar19->s);
              ins = BVar7 << 0x10 | BVar9 * 0x100 | uVar4;
            }
          }
          else {
            uVar4 = BVar15 - OPR_LT;
            if ((uVar4 & 1) != 0) {
              uVar4 = uVar4 ^ 3;
              expr_toval(pFVar20,(ExpDesc *)&local_60.s);
              paVar19 = &v->u;
              paVar18 = &local_60;
            }
            BVar9 = expr_toanyreg(pFVar20,(ExpDesc *)&paVar19->s);
            BVar7 = expr_toanyreg(pFVar20,(ExpDesc *)&paVar18->s);
            ins = BVar9 << 0x10 | uVar4 | BVar7 << 8;
          }
          if ((paVar18[1].s.info == 0xc) && (pFVar20->nactvar <= (paVar18->s).info)) {
            pFVar20->freereg = pFVar20->freereg - 1;
          }
          if ((paVar19[1].s.info == VNONRELOC) &&
             (pFVar20->nactvar <= (((anon_union_8_3_2ce71dea_for_u *)&(paVar19->s).info)->s).info))
          {
            pFVar20->freereg = pFVar20->freereg - 1;
          }
          bcemit_INS(pFVar20,ins);
          BVar10 = bcemit_jmp(pFVar20);
          (v->u).s.info = BVar10;
          v->k = VJMP;
          ls = local_48;
          BVar6 = local_40;
          goto LAB_0011af34;
        }
        expr_discharge(pFVar20,(ExpDesc *)&local_60.s);
        BVar10 = v->f;
        l1 = &local_50;
      }
      jmp_append(pFVar20,l1,BVar10);
      *(ulong *)&v->f = CONCAT44(uStack_4c,local_50);
      aVar3.s.aux = local_60.s.aux;
      aVar3.s.info = local_60.s.info;
      v->u = aVar3;
      v->k = iStack_58;
      v->t = BStack_54;
    }
LAB_0011af34:
    uVar16 = (ulong)BVar6;
  } while (BVar6 != OPR_NOBINOPR);
  BVar15 = OPR_NOBINOPR;
switchD_0011aa06_caseD_26:
  ls->level = ls->level - 1;
  return BVar15;
}

Assistant:

static BinOpr expr_binop(LexState *ls, ExpDesc *v, uint32_t limit)
{
  BinOpr op;
  synlevel_begin(ls);
  expr_unop(ls, v);
  op = token2binop(ls->token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    ExpDesc v2;
    BinOpr nextop;
    lj_lex_next(ls);
    bcemit_binop_left(ls->fs, op, v);
    /* Parse binary expression with higher priority. */
    nextop = expr_binop(ls, &v2, priority[op].right);
    bcemit_binop(ls->fs, op, v, &v2);
    op = nextop;
  }
  synlevel_end(ls);
  return op;  /* Return unconsumed binary operator (if any). */
}